

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall Clasp::mt::ParallelHandler::clearDB(ParallelHandler *this,Solver *s)

{
  pointer ppCVar1;
  Constraint *c;
  uint32 size;
  uint32 i;
  uint uVar2;
  long lVar3;
  
  ppCVar1 = (this->integrated_).ebo_.buf;
  uVar2 = (this->integrated_).ebo_.size;
  for (lVar3 = 0; (ulong)uVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    c = *(Constraint **)((long)ppCVar1 + lVar3);
    if (s == (Solver *)0x0) {
      (*c->_vptr_Constraint[5])(c,0,0);
    }
    else {
      size = (*c->_vptr_Constraint[0x13])(c);
      Solver::addLearnt(s,c,size,Other);
    }
  }
  (this->integrated_).ebo_.size = 0;
  this->intEnd_ = 0;
  for (uVar2 = 0; uVar2 != this->recEnd_; uVar2 = uVar2 + 1) {
    SharedLiterals::release(this->received_[uVar2]);
  }
  this->recEnd_ = 0;
  return;
}

Assistant:

void ParallelHandler::clearDB(Solver* s) {
	for (ClauseDB::iterator it = integrated_.begin(), end = integrated_.end(); it != end; ++it) {
		ClauseHead* c = static_cast<ClauseHead*>(*it);
		if (s) { s->addLearnt(c, c->size(), Constraint_t::Other); }
		else   { c->destroy(); }
	}
	integrated_.clear();
	intEnd_= 0;
	for (uint32 i = 0; i != recEnd_; ++i) { received_[i]->release(); }
	recEnd_= 0;
}